

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::ipv4_peer::ipv4_peer(ipv4_peer *this,endpoint *ep,bool c,peer_source_flags_t src)

{
  unsigned_short port_;
  address local_48;
  uchar local_22;
  byte local_21;
  endpoint *peStack_20;
  bool c_local;
  endpoint *ep_local;
  ipv4_peer *this_local;
  peer_source_flags_t src_local;
  
  local_21 = c;
  peStack_20 = ep;
  ep_local = (endpoint *)this;
  this_local._7_1_ = src.m_val;
  port_ = boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port(ep);
  local_22 = this_local._7_1_;
  torrent_peer::torrent_peer(&this->super_torrent_peer,port_,(bool)(local_21 & 1),this_local._7_1_);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address(&local_48,peStack_20);
  boost::asio::ip::address::to_v4((address *)&this->addr);
  *(uint *)&(this->super_torrent_peer).field_0x1b =
       *(uint *)&(this->super_torrent_peer).field_0x1b & 0xfeffffff;
  *(uint *)&(this->super_torrent_peer).field_0x1b =
       *(uint *)&(this->super_torrent_peer).field_0x1b & 0xfdffffff;
  return;
}

Assistant:

ipv4_peer::ipv4_peer(tcp::endpoint const& ep, bool c
		, peer_source_flags_t const src)
		: torrent_peer(ep.port(), c, src)
		, addr(ep.address().to_v4())
	{
		is_v6_addr = false;
#if TORRENT_USE_I2P
		is_i2p_addr = false;
#endif
#if TORRENT_USE_RTC
		is_rtc_addr = false;
#endif
	}